

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O0

void Hpipe::anon_unknown_5::output_rec(ostream *ss,Node *node)

{
  double dVar1;
  bool bVar2;
  Node *pNVar3;
  ostream *poVar4;
  bool use_neg;
  Node *node_local;
  ostream *ss_local;
  
  bVar2 = AutoPtr::operator_cast_to_bool((AutoPtr *)&node->ok);
  if (bVar2) {
    pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ok);
    dVar1 = pNVar3->freq;
    pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ko);
    bVar2 = pNVar3->freq <= dVar1;
    if ((node->use_equ & 1U) == 0) {
      if (bVar2) {
        poVar4 = std::operator<<(ss,"if ( *data < ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,node->beg);
        std::operator<<(poVar4," ) { ");
        pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
        output_rec(ss,pNVar3);
        std::operator<<(ss," } else { ");
        pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
        output_rec(ss,pNVar3);
        std::operator<<(ss," }");
      }
      else {
        poVar4 = std::operator<<(ss,"if ( *data >= ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,node->beg);
        std::operator<<(poVar4," ) { ");
        pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
        output_rec(ss,pNVar3);
        std::operator<<(ss," } else { ");
        pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
        output_rec(ss,pNVar3);
        std::operator<<(ss," }");
      }
    }
    else if (bVar2) {
      poVar4 = std::operator<<(ss,"if ( *data == ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,node->beg);
      std::operator<<(poVar4," ) { ");
      pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
      output_rec(ss,pNVar3);
      std::operator<<(ss," } else { ");
      pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
      output_rec(ss,pNVar3);
      std::operator<<(ss," }");
    }
    else {
      poVar4 = std::operator<<(ss,"if ( *data != ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,node->beg);
      std::operator<<(poVar4," ) { ");
      pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
      output_rec(ss,pNVar3);
      std::operator<<(ss," } else { ");
      pNVar3 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
      output_rec(ss,pNVar3);
      std::operator<<(ss," }");
    }
  }
  else {
    if (node->name != (char *)0x0) {
      std::operator<<(ss,node->name);
    }
    poVar4 = std::operator<<(ss,"/*");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,node->freq);
    std::operator<<(poVar4,"*/");
  }
  return;
}

Assistant:

static void output_rec( std::ostream &ss, const BranchSet::Node *node ) {
    if ( node->ok ) {
        bool use_neg = node->ok->freq < node->ko->freq;
        if ( node->use_equ ) {
            if ( use_neg ) {
                ss << "if ( *data != " << node->beg << " ) { ";
                output_rec( ss, node->ko.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ok.ptr() );
                ss << " }";
            } else {
                ss << "if ( *data == " << node->beg << " ) { ";
                output_rec( ss, node->ok.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ko.ptr() );
                ss << " }";
            }
        } else {
            if ( use_neg ) {
                ss << "if ( *data >= " << node->beg << " ) { ";
                output_rec( ss, node->ko.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ok.ptr() );
                ss << " }";
            } else {
                ss << "if ( *data < " << node->beg << " ) { ";
                output_rec( ss, node->ok.ptr() );
                ss << " } else { ";
                output_rec( ss, node->ko.ptr() );
                ss << " }";
            }
        }
    } else {
        if ( node->name )
            ss << node->name;
        ss << "/*" << node->freq << "*/";
    }
}